

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::fboc::details::RenderableParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,RenderableParams *this,RenderableParams *params)

{
  ImageFormat IVar1;
  char *pcVar2;
  string typeStr;
  string fmtStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string s;
  
  IVar1 = this->format;
  pcVar2 = glu::getTextureFormatName(IVar1.format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,pcVar2,(allocator<char> *)&fmtStr)
  ;
  std::__cxx11::string::substr((ulong)&typeStr,(ulong)&s);
  de::toLower(&fmtStr,&typeStr);
  std::__cxx11::string::~string((string *)&typeStr);
  if ((ulong)IVar1 >> 0x20 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&fmtStr);
  }
  else {
    pcVar2 = glu::getTypeName(IVar1.unsizedType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeStr,pcVar2,(allocator<char> *)&local_98);
    std::operator+(&local_98,&fmtStr,"_");
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&typeStr);
    de::toLower(&local_58,&local_78);
    std::operator+(__return_storage_ptr__,&local_98,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&typeStr);
  }
  std::__cxx11::string::~string((string *)&fmtStr);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

static string		getName				(const RenderableParams& params)
	{
		return formatName(params.format);
	}